

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# treeep.cpp
# Opt level: O0

double __thiscall libDAI::TreeEP::run(TreeEP *this)

{
  bool bVar1;
  long lVar2;
  ostream *poVar3;
  ulong uVar4;
  long *plVar5;
  ulong uVar6;
  undefined8 uVar7;
  clock_t cVar8;
  void *this_00;
  long *in_RDI;
  double dVar9;
  vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *in_stack_000000c0;
  vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *in_stack_000000c8;
  TreeEPSubTree *in_stack_000000d0;
  Factor nb;
  size_t i_1;
  size_t I;
  size_t i;
  vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> old_beliefs;
  Diffs diffs;
  clock_t tic;
  Diffs *in_stack_fffffffffffffd38;
  TreeEP *in_stack_fffffffffffffd40;
  TFactor<double> *in_stack_fffffffffffffd48;
  vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
  *in_stack_fffffffffffffd50;
  double in_stack_fffffffffffffd60;
  long in_stack_fffffffffffffd68;
  Diffs *in_stack_fffffffffffffd70;
  key_type *in_stack_fffffffffffffd78;
  map<unsigned_long,_libDAI::TreeEP::TreeEPSubTree,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_libDAI::TreeEP::TreeEPSubTree>_>_>
  *in_stack_fffffffffffffd80;
  double in_stack_fffffffffffffdb8;
  Diffs *in_stack_fffffffffffffdc0;
  vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
  *in_stack_fffffffffffffe10;
  vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
  *in_stack_fffffffffffffe18;
  TreeEPSubTree *in_stack_fffffffffffffe20;
  undefined1 local_118 [56];
  ulong local_e0;
  ulong local_d8;
  undefined1 local_d0 [56];
  ulong local_98;
  vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> local_90 [3];
  clock_t local_40;
  string local_28 [40];
  
  lVar2 = (**(code **)(*in_RDI + 0x30))();
  if (lVar2 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Starting ");
    (**(code **)(*in_RDI + 0x48))();
    poVar3 = std::operator<<(poVar3,local_28);
    std::operator<<(poVar3,"...");
    std::__cxx11::string::~string(local_28);
  }
  uVar4 = (**(code **)(*in_RDI + 0x30))();
  if (2 < uVar4) {
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  }
  local_40 = toc();
  plVar5 = (long *)(**(code **)(*in_RDI + 0x28))();
  (**(code **)(*plVar5 + 0x28))();
  Diffs::Diffs(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::vector
            ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)0xb9bf3b)
  ;
  plVar5 = (long *)(**(code **)(*in_RDI + 0x28))();
  (**(code **)(*plVar5 + 0x28))();
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::reserve
            ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)
             in_stack_fffffffffffffd80,(size_type)in_stack_fffffffffffffd78);
  local_98 = 0;
  while( true ) {
    uVar4 = local_98;
    plVar5 = (long *)(**(code **)(*in_RDI + 0x28))();
    uVar6 = (**(code **)(*plVar5 + 0x28))();
    if (uVar6 <= uVar4) break;
    plVar5 = (long *)(**(code **)(*in_RDI + 0x28))();
    uVar7 = (**(code **)(*plVar5 + 0x30))(plVar5,local_98);
    (**(code **)(*in_RDI + 0x50))(local_d0,in_RDI,uVar7);
    std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::push_back
              ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)
               in_stack_fffffffffffffd40,(value_type *)in_stack_fffffffffffffd38);
    TFactor<double>::~TFactor((TFactor<double> *)in_stack_fffffffffffffd40);
    local_98 = local_98 + 1;
  }
  in_RDI[0x51] = 0;
  while( true ) {
    bVar1 = false;
    if ((ulong)in_RDI[0x51] < (ulong)in_RDI[0x4e]) {
      dVar9 = Diffs::max(in_stack_fffffffffffffd38);
      bVar1 = (double)in_RDI[0x4d] < dVar9;
    }
    if (!bVar1) break;
    local_d8 = 0;
    while( true ) {
      uVar4 = local_d8;
      plVar5 = (long *)(**(code **)(*in_RDI + 0x28))();
      uVar6 = (**(code **)(*plVar5 + 0x48))();
      if (uVar6 <= uVar4) break;
      bVar1 = offtree(in_stack_fffffffffffffd40,(size_t)in_stack_fffffffffffffd38);
      if (bVar1) {
        std::
        map<unsigned_long,_libDAI::TreeEP::TreeEPSubTree,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_libDAI::TreeEP::TreeEPSubTree>_>_>
        ::operator[](in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
        TreeEPSubTree::InvertAndMultiply
                  (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
        std::
        map<unsigned_long,_libDAI::TreeEP::TreeEPSubTree,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_libDAI::TreeEP::TreeEPSubTree>_>_>
        ::operator[](in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
        TreeEPSubTree::HUGIN_with_I(in_stack_000000d0,in_stack_000000c8,in_stack_000000c0);
        std::
        map<unsigned_long,_libDAI::TreeEP::TreeEPSubTree,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_libDAI::TreeEP::TreeEPSubTree>_>_>
        ::operator[](in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
        TreeEPSubTree::InvertAndMultiply
                  (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
      }
      local_d8 = local_d8 + 1;
    }
    local_e0 = 0;
    while( true ) {
      uVar4 = local_e0;
      plVar5 = (long *)(**(code **)(*in_RDI + 0x28))();
      uVar6 = (**(code **)(*plVar5 + 0x28))();
      if (uVar6 <= uVar4) break;
      plVar5 = (long *)(**(code **)(*in_RDI + 0x28))();
      in_stack_fffffffffffffe20 = (TreeEPSubTree *)(**(code **)(*plVar5 + 0x30))(plVar5,local_e0);
      (**(code **)(*in_RDI + 0x50))(local_118,in_RDI,in_stack_fffffffffffffe20);
      std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::operator[]
                (local_90,local_e0);
      in_stack_fffffffffffffe18 =
           (vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)
           dist(in_stack_fffffffffffffd48,(TFactor<double> *)in_stack_fffffffffffffd40,
                (DistType)((ulong)in_stack_fffffffffffffd38 >> 0x20));
      Diffs::push(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
      std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::operator[]
                (local_90,local_e0);
      TFactor<double>::operator=
                ((TFactor<double> *)in_stack_fffffffffffffd40,
                 (TFactor<double> *)in_stack_fffffffffffffd38);
      TFactor<double>::~TFactor((TFactor<double> *)in_stack_fffffffffffffd40);
      local_e0 = local_e0 + 1;
    }
    in_stack_fffffffffffffe10 =
         (vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)
         (**(code **)(*in_RDI + 0x30))();
    if ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)0x2 <
        in_stack_fffffffffffffe10) {
      poVar3 = std::operator<<((ostream *)&std::cout,"TreeEP::run:  maxdiff ");
      dVar9 = Diffs::max(in_stack_fffffffffffffd38);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar9);
      poVar3 = std::operator<<(poVar3," after ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,in_RDI[0x51] + 1);
      poVar3 = std::operator<<(poVar3," passes");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
    in_RDI[0x51] = in_RDI[0x51] + 1;
  }
  dVar9 = Diffs::max(in_stack_fffffffffffffd38);
  if ((double)in_RDI[0x50] < dVar9) {
    dVar9 = Diffs::max(in_stack_fffffffffffffd38);
    in_RDI[0x50] = (long)dVar9;
  }
  lVar2 = (**(code **)(*in_RDI + 0x30))();
  if (lVar2 != 0) {
    dVar9 = Diffs::max(in_stack_fffffffffffffd38);
    if (dVar9 <= (double)in_RDI[0x4d]) {
      uVar4 = (**(code **)(*in_RDI + 0x30))();
      if (2 < uVar4) {
        std::operator<<((ostream *)&std::cout,"TreeEP::run:  ");
      }
      poVar3 = std::operator<<((ostream *)&std::cout,"converged in ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,in_RDI[0x51]);
      poVar3 = std::operator<<(poVar3," passes (");
      in_stack_fffffffffffffd50 =
           (vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)toc();
      poVar3 = (ostream *)
               std::ostream::operator<<(poVar3,(long)in_stack_fffffffffffffd50 - local_40);
      poVar3 = std::operator<<(poVar3," clocks).");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
    else {
      lVar2 = (**(code **)(*in_RDI + 0x30))();
      if (lVar2 == 1) {
        std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
      }
      poVar3 = std::operator<<((ostream *)&std::cout,"TreeEP::run:  WARNING: not converged within ")
      ;
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,in_RDI[0x4e]);
      poVar3 = std::operator<<(poVar3," passes (");
      cVar8 = toc();
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,cVar8 - local_40);
      poVar3 = std::operator<<(poVar3," clocks)...final maxdiff:");
      dVar9 = Diffs::max(in_stack_fffffffffffffd38);
      this_00 = (void *)std::ostream::operator<<(poVar3,dVar9);
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    }
  }
  dVar9 = Diffs::max(in_stack_fffffffffffffd38);
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::~vector
            (in_stack_fffffffffffffd50);
  Diffs::~Diffs((Diffs *)0xb9c894);
  return dVar9;
}

Assistant:

double TreeEP::run() {
        if( Verbose() >= 1 )
            cout << "Starting " << identify() << "...";
        if( Verbose() >= 3)
            cout << endl;

        clock_t tic = toc();
        Diffs diffs(grm().nrVars(), 1.0);

        vector<Factor> old_beliefs;
        old_beliefs.reserve( grm().nrVars() );
        for( size_t i = 0; i < grm().nrVars(); i++ )
            old_beliefs.push_back(belief(grm().var(i)));

        // do several passes over the network until maximum number of iterations has
        // been reached or until the maximum belief difference is smaller than tolerance
        for( _iterations = 0; _iterations < Props2.maxiter && diffs.max() > Props2.tol; _iterations++ ) {
            for( size_t I = 0; I < grm().nrFactors(); I++ )
                if( offtree(I) ) {  
                    _Q[I].InvertAndMultiply( _Qa, _Qb );
                    _Q[I].HUGIN_with_I( _Qa, _Qb );
                    _Q[I].InvertAndMultiply( _Qa, _Qb );
                }

            // calculate new beliefs and compare with old ones
            for( size_t i = 0; i < grm().nrVars(); i++ ) {
                Factor nb( belief(grm().var(i)) );
                diffs.push( dist( nb, old_beliefs[i], Prob::DISTLINF ) );
                old_beliefs[i] = nb;
            }

            if( Verbose() >= 3 )
                cout << "TreeEP::run:  maxdiff " << diffs.max() << " after " << _iterations+1 << " passes" << endl;
        }

        if( diffs.max() > _maxdiff )
            _maxdiff = diffs.max();

        if( Verbose() >= 1 ) {
            if( diffs.max() > Props2.tol ) {
                if( Verbose() == 1 )
                    cout << endl;
                cout << "TreeEP::run:  WARNING: not converged within " << Props2.maxiter << " passes (" << toc() - tic << " clocks)...final maxdiff:" << diffs.max() << endl;
            } else {
                if( Verbose() >= 3 )
                    cout << "TreeEP::run:  ";
                cout << "converged in " << _iterations << " passes (" << toc() - tic << " clocks)." << endl;
            }
        }

        return diffs.max();
    }